

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  uchar uVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  CURLUcode CVar8;
  Curl_URL *u_00;
  Curl_handler *pCVar9;
  size_t sVar10;
  uchar *__s;
  long lVar11;
  uchar *puVar12;
  size_t sVar13;
  char *pcVar14;
  Curl_URL *pCVar15;
  uint uVar16;
  uchar uVar17;
  byte bVar18;
  uchar *buffer;
  uint uVar19;
  uint uVar20;
  CURLUcode unaff_R15D;
  byte bVar21;
  char *oldurl;
  CURLU *local_78;
  long local_58;
  char *local_48;
  uchar *local_40;
  uint local_34;
  
  bVar21 = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      u = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto LAB_0014991b;
    }
    if (u == (CURLU *)0x0) {
      return CURLUE_OK;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
LAB_0014991b:
    return CURLUE_UNKNOWN_PART;
  }
  bVar18 = (byte)(flags >> 7) & 1;
  switch(what) {
  case CURLUPART_URL:
    _Var5 = Curl_is_absolute_url(part,(char *)0x0,0x29);
    if ((_Var5) || (CVar8 = curl_url_get(u,CURLUPART_URL,&local_48,flags), CVar8 != CURLUE_OK)) {
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x68,1);
      if (u_00 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar8 = parseurl(part,u_00,flags);
      if (CVar8 == CURLUE_OK) {
        free_urlhandle(u);
        pCVar15 = u_00;
        for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
          u->scheme = pCVar15->scheme;
          pCVar15 = (Curl_URL *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
          u = (CURLU *)((long)u + (ulong)bVar21 * -0x10 + 8);
        }
      }
      else {
        free_urlhandle(u_00);
      }
    }
    else {
      pCVar15 = (Curl_URL *)concat_url(local_48,part);
      (*Curl_cfree)(local_48);
      if (pCVar15 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x68,1);
      if (u_00 == (Curl_URL *)0x0) {
        CVar8 = CURLUE_OUT_OF_MEMORY;
        u_00 = pCVar15;
      }
      else {
        CVar8 = parseurl((char *)pCVar15,u_00,flags);
        (*Curl_cfree)(pCVar15);
        if (CVar8 == CURLUE_OK) {
          free_urlhandle(u);
          pCVar15 = u_00;
          for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
            u->scheme = pCVar15->scheme;
            pCVar15 = (Curl_URL *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
            u = (CURLU *)((long)u + (ulong)bVar21 * -0x10 + 8);
          }
        }
        else {
          free_urlhandle(u_00);
        }
      }
    }
    (*Curl_cfree)(u_00);
    return CVar8;
  case CURLUPART_SCHEME:
    sVar10 = strlen(part);
    unaff_R15D = CURLUE_MALFORMED_INPUT;
    if (0x28 < sVar10) {
      return CURLUE_MALFORMED_INPUT;
    }
    bVar3 = 1;
    if (((flags & 8) == 0) && (pCVar9 = Curl_builtin_scheme(part), pCVar9 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar7 = 0;
    bVar21 = 0;
    bVar18 = 0;
    local_58 = 0;
    local_78 = u;
    goto LAB_001494ad;
  case CURLUPART_USER:
    local_78 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_78 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_78 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_78 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_58 = strtol(part,&local_48,10);
    if (local_58 - 0x10000U < 0xffffffffffff0001) {
      unaff_R15D = CURLUE_BAD_PORT_NUMBER;
LAB_0014978c:
      bVar2 = false;
      local_78 = (CURLU *)0x0;
    }
    else {
      if (*local_48 != '\0') {
        unaff_R15D = CURLUE_MALFORMED_INPUT;
        goto LAB_0014978c;
      }
      local_78 = (CURLU *)&u->port;
      bVar2 = true;
    }
    if (!bVar2) {
      return unaff_R15D;
    }
    bVar3 = 1;
    uVar7 = 0;
    bVar21 = 0;
    bVar18 = 0;
    goto LAB_001494ad;
  case CURLUPART_PATH:
    local_78 = (CURLU *)&u->path;
    bVar3 = 0;
    goto LAB_0014949b;
  case CURLUPART_QUERY:
    uVar7 = flags >> 8;
    local_78 = (CURLU *)&u->query;
    bVar3 = 1;
    local_58 = 0;
    bVar21 = bVar18;
    goto LAB_001494ad;
  case CURLUPART_FRAGMENT:
    local_78 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_78 = (CURLU *)&u->zoneid;
  }
  bVar3 = 1;
LAB_0014949b:
  uVar7 = 0;
  local_58 = 0;
  bVar21 = 0;
LAB_001494ad:
  sVar10 = strlen(part);
  if (sVar10 < 0x7a1201) {
    local_34 = flags;
    if (bVar18 == 0) {
      __s = (uchar *)(*Curl_cstrdup)(part);
      puVar12 = __s;
      if (__s != (uchar *)0x0) {
        do {
          lVar11 = 1;
          if (*puVar12 == '%') {
            iVar6 = Curl_isxdigit((uint)puVar12[1]);
            if (((iVar6 != 0) && (iVar6 = Curl_isxdigit((uint)puVar12[2]), iVar6 != 0)) &&
               ((iVar6 = Curl_isupper((uint)puVar12[1]), iVar6 != 0 ||
                (iVar6 = Curl_isupper((uint)puVar12[2]), iVar6 != 0)))) {
              iVar6 = tolower((uint)puVar12[1]);
              puVar12[1] = (uchar)iVar6;
              iVar6 = tolower((uint)puVar12[2]);
              puVar12[2] = (uchar)iVar6;
              lVar11 = 3;
            }
          }
          else if (*puVar12 == '\0') goto LAB_00149608;
          puVar12 = puVar12 + lVar11;
        } while( true );
      }
      unaff_R15D = CURLUE_OUT_OF_MEMORY;
LAB_00149608:
      if (__s != (uchar *)0x0) goto LAB_001497ed;
    }
    else {
      __s = (uchar *)(*Curl_cmalloc)(sVar10 * 3 + 1);
      if (__s == (uchar *)0x0) {
        unaff_R15D = CURLUE_OUT_OF_MEMORY;
        bVar2 = false;
        __s = (uchar *)part;
      }
      else {
        puVar12 = (uchar *)part;
        if (bVar21 == 0) {
LAB_00149635:
          uVar4 = *puVar12;
          buffer = __s;
          local_40 = puVar12;
          if (uVar4 != '\0') {
            uVar19 = uVar7;
            do {
              _Var5 = Curl_isunreserved(uVar4);
              if ((_Var5) || (uVar4 = *puVar12, (bool)(~bVar3 & uVar4 == '/'))) {
LAB_001496bf:
                uVar16 = uVar19 & 0xff;
                uVar20 = uVar16;
                if ((uVar19 & 1) != 0) {
                  uVar20 = 0;
                }
                uVar19 = uVar20;
                if (*puVar12 != '=') {
                  uVar19 = uVar16;
                }
                *buffer = *puVar12;
                lVar11 = 1;
              }
              else {
                if (uVar4 == '=') {
                  if ((uVar19 & 1) != 0) goto LAB_001496bf;
                }
                else if (uVar4 == '+' && bVar21 == 1) goto LAB_001496bf;
                curl_msnprintf((char *)buffer,4,"%%%02x");
                lVar11 = 3;
              }
              buffer = buffer + lVar11;
              uVar4 = puVar12[1];
              puVar12 = puVar12 + 1;
            } while (uVar4 != '\0');
          }
          *buffer = '\0';
          bVar2 = true;
          part = (char *)__s;
          if (bVar21 == 0) goto LAB_001497df;
        }
        else {
          lVar11 = 0;
          while( true ) {
            uVar4 = part[lVar11];
            uVar17 = '+';
            if ((uVar4 != ' ') && (uVar17 = uVar4, uVar4 == '\0')) break;
            __s[lVar11] = uVar17;
            lVar11 = lVar11 + 1;
          }
          __s[lVar11] = '\0';
          puVar12 = (uchar *)(*Curl_cstrdup)((char *)__s);
          if (puVar12 != (uchar *)0x0) goto LAB_00149635;
          unaff_R15D = CURLUE_OUT_OF_MEMORY;
          bVar2 = false;
          local_40 = __s;
        }
        (*Curl_cfree)(local_40);
        __s = (uchar *)part;
      }
LAB_001497df:
      if (bVar2) {
LAB_001497ed:
        if ((uVar7 & 1) != 0) {
          pcVar14 = u->query;
          if (pcVar14 == (char *)0x0) {
            sVar10 = 0;
          }
          else {
            sVar10 = strlen(pcVar14);
          }
          if (sVar10 != 0) {
            cVar1 = pcVar14[sVar10 - 1];
            sVar13 = strlen((char *)__s);
            lVar11 = (cVar1 != '&') + sVar10;
            pcVar14 = (char *)(*Curl_cmalloc)(sVar13 + lVar11 + 1);
            if (pcVar14 == (char *)0x0) {
              (*Curl_cfree)(__s);
              unaff_R15D = CURLUE_OUT_OF_MEMORY;
            }
            else {
              strcpy(pcVar14,u->query);
              if (cVar1 != '&') {
                pcVar14[sVar10] = '&';
              }
              strcpy(pcVar14 + lVar11,(char *)__s);
              (*Curl_cfree)(__s);
              (*Curl_cfree)(local_78->scheme);
              local_78->scheme = pcVar14;
              unaff_R15D = CURLUE_OK;
            }
          }
          if (sVar10 != 0) goto LAB_001498b3;
        }
        if ((what != CURLUPART_HOST) ||
           ((((local_34 >> 10 & 1) != 0 && (*__s == '\0')) ||
            (CVar8 = hostname_check(u,(char *)__s), CVar8 == CURLUE_OK)))) {
          (*Curl_cfree)(local_78->scheme);
          local_78->scheme = (char *)__s;
          bVar2 = true;
          goto LAB_00149906;
        }
        (*Curl_cfree)(__s);
        goto LAB_001494bd;
      }
    }
LAB_001498b3:
    bVar2 = false;
  }
  else {
LAB_001494bd:
    bVar2 = false;
    unaff_R15D = CURLUE_MALFORMED_INPUT;
  }
LAB_00149906:
  if ((bVar2) && (unaff_R15D = CURLUE_OK, local_58 != 0)) {
    u->portnum = local_58;
  }
  return unaff_R15D;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_MALFORMED_INPUT;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_MALFORMED_INPUT;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN + 1)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = (const unsigned char *)part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* null-terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = (const unsigned char *)part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && equalsencode) ||
           ((*i == '+') && plusencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          *o = *i;
          o++;
        }
        else {
          msnprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* null-terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    if(what == CURLUPART_HOST) {
      if(0 == strlen(newp) && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp)) {
          free((char *)newp);
          return CURLUE_MALFORMED_INPUT;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}